

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.h
# Opt level: O0

uchar BitScanReverse64(PDWORD Index,UINT64 qwMask)

{
  long lVar1;
  undefined1 local_19;
  int countLeadingZero;
  uchar bRet;
  UINT64 qwMask_local;
  PDWORD Index_local;
  
  local_19 = '\0';
  if (qwMask != 0) {
    lVar1 = 0x3f;
    if (qwMask != 0) {
      for (; qwMask >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    *Index = 0x3f - ((uint)lVar1 ^ 0x3f);
    local_19 = '\x01';
  }
  return local_19;
}

Assistant:

unsigned char
PALAPI
BitScanReverse64(
    IN OUT PDWORD Index,
    IN UINT64 qwMask)
{
    unsigned char bRet = FALSE;
    if (qwMask != 0)
    {
        static_assert(sizeof(qwMask) <= sizeof(unsigned long long),
                      "use correct __builtin_clz??? variant");
        int countLeadingZero = __builtin_clzll(qwMask);
        *Index = (DWORD)(sizeof(qwMask) * 8 - 1 - countLeadingZero);
        bRet = TRUE;
    }

    return bRet;
}